

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-curse.c
# Opt level: O2

void curse_menu_browser(wchar_t oid,void *data,region_conflict *loc)

{
  char buf [80];
  
  text_out_wrap = L'\0';
  text_out_hook = text_out_to_screen;
  text_out_indent = loc->col + L'\xffffffff';
  text_out_pad = L'\x01';
  Term_gotoxy(loc->col,loc->page_rows + loc->row);
  my_strcpy(buf,curses[*(int *)((long)data + (long)oid * 8)].desc,0x50);
  my_strcap(buf);
  text_out(" %s.\n",buf);
  text_out_pad = L'\0';
  text_out_indent = L'\0';
  return;
}

Assistant:

static void curse_menu_browser(int oid, void *data, const region *loc)
{
	struct curse_menu_data *choice = data;
	char buf[80];

	/* Redirect output to the screen */
	text_out_hook = text_out_to_screen;
	text_out_wrap = 0;
	text_out_indent = loc->col - 1;
	text_out_pad = 1;

	Term_gotoxy(loc->col, loc->row + loc->page_rows);
	my_strcpy(buf, curses[choice[oid].index].desc, sizeof(buf));
	my_strcap(buf);
	text_out(" %s.\n", buf);

	/* XXX */
	text_out_pad = 0;
	text_out_indent = 0;
}